

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::FramebufferMinimumValueCase::iterate
          (FramebufferMinimumValueCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  Enum<int,_2UL> *value;
  ScopedLogSection section_1;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> tiedToValue;
  ScopedLogSection section;
  ResultCollector result;
  allocator<char> local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ScopedLogSection local_108;
  string local_100;
  CallLogWrapper local_e0;
  StateQueryMemoryWriteGuard<int> local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  ResultCollector local_78;
  code *local_28;
  GLenum local_20;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_e0,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148," // ERROR: ",(allocator<char> *)&local_128);
  tcu::ResultCollector::ResultCollector(&local_78,pTVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  local_e0.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Minimum",(allocator<char> *)&local_98);
  de::toString<int>(&local_100,&this->m_minValue);
  std::operator+(&local_128,"Specified minimum is ",&local_100);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_b8,pTVar1,&local_148,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_148);
  gls::StateQueryUtil::verifyStateIntegerMin
            (&local_78,&local_e0,this->m_target,this->m_minValue,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_b8);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Ties",(allocator<char> *)&local_98);
  local_b8._M_string_length._0_4_ = this->m_tiedTo;
  local_b8._M_dataplus._M_p = (pointer)glu::getGettableStateName;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_100,(de *)&local_b8,value);
  std::operator+(&local_128,"The limit is tied to the value of ",&local_100);
  tcu::ScopedLogSection::ScopedLogSection(&local_108,pTVar1,&local_148,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_148);
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&local_c4);
  glu::CallLogWrapper::glGetIntegerv(&local_e0,this->m_tiedTo,&local_c4.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&local_e0);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_149);
    local_28 = glu::getErrorName;
    local_20 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_28);
    std::operator+(&local_100,&local_b8,&local_98);
    std::operator+(&local_128,&local_100,": ");
    std::operator+(&local_148,&local_128,"glGetIntegerv");
    tcu::ResultCollector::fail(&local_78,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar2 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&local_c4,&local_78);
  if (bVar2) {
    gls::StateQueryUtil::verifyStateIntegerMin
              (&local_78,&local_e0,this->m_target,local_c4.m_value,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_108);
  tcu::ResultCollector::setTestContextResult
            (&local_78,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&local_78);
  glu::CallLogWrapper::~CallLogWrapper(&local_e0);
  return STOP;
}

Assistant:

FramebufferMinimumValueCase::IterateResult FramebufferMinimumValueCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Minimum", "Specified minimum is " + de::toString(m_minValue));

		verifyStateIntegerMin(result, gl, m_target, m_minValue, m_verifierType);
	}
	{
		const tcu::ScopedLogSection				section		(m_testCtx.getLog(), "Ties", "The limit is tied to the value of " + de::toString(glu::getGettableStateStr(m_tiedTo)));
		StateQueryMemoryWriteGuard<glw::GLint>	tiedToValue;

		gl.glGetIntegerv(m_tiedTo, &tiedToValue);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

		if (tiedToValue.verifyValidity(result))
			verifyStateIntegerMin(result, gl, m_target, tiedToValue, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}